

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::inString(Tokenizer *this,char ch)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  iVar3 = (int)CONCAT71(in_register_00000031,ch);
  cVar2 = (char)this;
  if (iVar3 == 10) {
LAB_001afc12:
    std::__cxx11::string::push_back(cVar2 + '\x10');
    return;
  }
  if (iVar3 == 0xd) {
    std::__cxx11::string::push_back(cVar2 + '\x10');
    this->state = st_string_after_cr;
  }
  else {
    if (iVar3 != 0x28) {
      if (iVar3 == 0x29) {
        piVar1 = &this->string_depth;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          this->type = tt_string;
          this->state = st_token_ready;
          return;
        }
      }
      else if (iVar3 == 0x5c) {
        this->state = st_string_escape;
        return;
      }
      goto LAB_001afc12;
    }
    std::__cxx11::string::push_back(cVar2 + '\x10');
    this->string_depth = this->string_depth + 1;
  }
  return;
}

Assistant:

void
Tokenizer::inString(char ch)
{
    switch (ch) {
    case '\\':
        state = st_string_escape;
        return;

    case '(':
        val += ch;
        ++string_depth;
        return;

    case ')':
        if (--string_depth == 0) {
            type = tt::tt_string;
            state = st_token_ready;
            return;
        }

        val += ch;
        return;

    case '\r':
        // CR by itself is converted to LF
        val += '\n';
        state = st_string_after_cr;
        return;

    case '\n':
        val += ch;
        return;

    default:
        val += ch;
        return;
    }
}